

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::show_self(Fl_Tree_Item *this,char *indent)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  Fl_Tree_Item *pFVar5;
  char *local_40;
  int local_2c;
  int t;
  char *i2;
  char *thelabel;
  char *indent_local;
  Fl_Tree_Item *this_local;
  
  pcVar3 = label(this);
  if (pcVar3 == (char *)0x0) {
    local_40 = "(NULL)";
  }
  else {
    local_40 = label(this);
  }
  uVar1 = children(this);
  pFVar5 = this->_parent;
  iVar2 = depth(this);
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",indent,local_40,(ulong)uVar1,this,
         pFVar5,iVar2);
  iVar2 = children(this);
  if (iVar2 != 0) {
    sVar4 = strlen(indent);
    pcVar3 = (char *)operator_new__(sVar4 + 2);
    strcpy(pcVar3,indent);
    strcat(pcVar3," |");
    for (local_2c = 0; iVar2 = children(this), local_2c < iVar2; local_2c = local_2c + 1) {
      pFVar5 = child(this,local_2c);
      show_self(pFVar5,pcVar3);
    }
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fl_Tree_Item::show_self(const char *indent) const {
  const char *thelabel = label() ? label() : "(NULL)";
#if FLTK_ABI_VERSION >= 10301
  printf("%s-%s (%d children, this=%p, parent=%p, prev=%p, next=%p, depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent,
	 _prev_sibling, _next_sibling, depth());
#else /*FLTK_ABI_VERSION*/
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent, depth());
#endif /*FLTK_ABI_VERSION*/
  if ( children() ) {
    char *i2 = new char [strlen(indent)+2];
    strcpy(i2, indent);
    strcat(i2, " |");
    for ( int t=0; t<children(); t++ ) {
      child(t)->show_self(i2);
    }
    delete[] i2;
  }
  fflush(stdout);
}